

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int sign_certificate(ptls_sign_certificate_t *_self,ptls_t *tls,uint16_t *selected_algorithm,
                    ptls_buffer_t *outbuf,ptls_iovec_t input,uint16_t *algorithms,
                    size_t num_algorithms)

{
  int iVar1;
  size_t local_58;
  size_t i;
  st_ptls_openssl_signature_scheme_t *scheme;
  ptls_openssl_sign_certificate_t *self;
  ptls_buffer_t *outbuf_local;
  uint16_t *selected_algorithm_local;
  ptls_t *tls_local;
  ptls_sign_certificate_t *_self_local;
  ptls_iovec_t input_local;
  
  i = (size_t)(_self + 2);
  do {
    if (*(short *)i == -1) {
      return 0x28;
    }
    for (local_58 = 0; local_58 != num_algorithms; local_58 = local_58 + 1) {
      if (algorithms[local_58] == *(uint16_t *)i) {
        *selected_algorithm = *(uint16_t *)i;
        iVar1 = do_sign((EVP_PKEY *)_self[1].cb,outbuf,input,*(EVP_MD **)(i + 8));
        return iVar1;
      }
    }
    i = i + 0x10;
  } while( true );
}

Assistant:

static int sign_certificate(ptls_sign_certificate_t *_self, ptls_t *tls, uint16_t *selected_algorithm, ptls_buffer_t *outbuf,
                            ptls_iovec_t input, const uint16_t *algorithms, size_t num_algorithms)
{
    ptls_openssl_sign_certificate_t *self = (ptls_openssl_sign_certificate_t *)_self;
    const struct st_ptls_openssl_signature_scheme_t *scheme;

    /* select the algorithm */
    for (scheme = self->schemes; scheme->scheme_id != UINT16_MAX; ++scheme) {
        size_t i;
        for (i = 0; i != num_algorithms; ++i)
            if (algorithms[i] == scheme->scheme_id)
                goto Found;
    }
    return PTLS_ALERT_HANDSHAKE_FAILURE;

Found:
    *selected_algorithm = scheme->scheme_id;
    return do_sign(self->key, outbuf, input, scheme->scheme_md);
}